

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

Error __thiscall asmjit::JitRuntime::_add(JitRuntime *this,void **dst,CodeHolder *code)

{
  size_t sVar1;
  void *pvVar2;
  size_t sVar3;
  undefined8 *in_RSI;
  CodeHolder *in_RDI;
  size_t relocSize;
  void *p;
  size_t codeSize;
  CodeHolder *in_stack_00000040;
  uint32_t in_stack_ffffffffffffffac;
  VMemMgr *in_stack_ffffffffffffffb8;
  Error local_18;
  
  sVar1 = CodeHolder::getCodeSize(in_RDI);
  if (sVar1 == 0) {
    *in_RSI = 0;
    local_18 = 10;
  }
  else {
    pvVar2 = VMemMgr::alloc(in_stack_ffffffffffffffb8,(size_t)in_RDI,in_stack_ffffffffffffffac);
    if (pvVar2 == (void *)0x0) {
      *in_RSI = 0;
      local_18 = 2;
    }
    else {
      sVar3 = CodeHolder::relocate(in_stack_00000040,this,(uint64_t)dst);
      if (sVar3 == 0) {
        *in_RSI = 0;
        VMemMgr::release((VMemMgr *)codeSize,p);
        local_18 = 4;
      }
      else {
        if (sVar3 < sVar1) {
          VMemMgr::shrink((VMemMgr *)code,(void *)codeSize,(size_t)p);
        }
        (**(code **)(*(long *)&in_RDI->_codeInfo + 0x20))(in_RDI,pvVar2,sVar3);
        *in_RSI = pvVar2;
        local_18 = 0;
      }
    }
  }
  return local_18;
}

Assistant:

Error JitRuntime::_add(void** dst, CodeHolder* code) noexcept {
  size_t codeSize = code->getCodeSize();
  if (ASMJIT_UNLIKELY(codeSize == 0)) {
    *dst = nullptr;
    return DebugUtils::errored(kErrorNoCodeGenerated);
  }

  void* p = _memMgr.alloc(codeSize, getAllocType());
  if (ASMJIT_UNLIKELY(!p)) {
    *dst = nullptr;
    return DebugUtils::errored(kErrorNoVirtualMemory);
  }

  // Relocate the code and release the unused memory back to `VMemMgr`.
  size_t relocSize = code->relocate(p);
  if (ASMJIT_UNLIKELY(relocSize == 0)) {
    *dst = nullptr;
    _memMgr.release(p);
    return DebugUtils::errored(kErrorInvalidState);
  }

  if (relocSize < codeSize)
    _memMgr.shrink(p, relocSize);

  flush(p, relocSize);
  *dst = p;

  return kErrorOk;
}